

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat2.c
# Opt level: O0

void mul_mat_f32_naive(float *src0,float *src1,float *dst,int m,int n,int k)

{
  undefined1 auVar1 [16];
  int l;
  float sum;
  int j;
  int i;
  int k_local;
  int n_local;
  int m_local;
  float *dst_local;
  float *src1_local;
  float *src0_local;
  
  for (i = 0; i < m; i = i + 1) {
    for (j = 0; j < n; j = j + 1) {
      sum = 0.0;
      for (l = 0; l < k; l = l + 1) {
        auVar1 = vfmadd213ss_fma(ZEXT416((uint)src1[j * k + l]),ZEXT416((uint)src0[i * k + l]),
                                 ZEXT416((uint)sum));
        sum = auVar1._0_4_;
      }
      dst[i * n + j] = sum;
    }
  }
  return;
}

Assistant:

void mul_mat_f32_naive(
    const float * restrict src0, // M x K
    const float * restrict src1, // N x K (transposed)
    float * dst,
    int m, int n, int k) {
    for (int i = 0; i < m; i++) {
        for (int j = 0; j < n; j++) {
            float sum = 0;
            for (int l = 0; l < k; l++) {
                sum += src0[i*k + l] * src1[j*k + l];
            }
            dst[i*n + j] = sum;
        }
    }
}